

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_xmove(lua_State *from,lua_State *to,int n)

{
  StkId pSVar1;
  StkId pSVar2;
  TValue *io2;
  TValue *io1;
  int i;
  int n_local;
  lua_State *to_local;
  lua_State *from_local;
  
  if (from != to) {
    (from->top).p = (from->top).p + -(long)n;
    for (io1._0_4_ = 0; (int)io1 < n; io1._0_4_ = (int)io1 + 1) {
      pSVar1 = (to->top).p;
      pSVar2 = (from->top).p;
      (pSVar1->val).value_ = pSVar2[(int)io1].val.value_;
      (pSVar1->val).tt_ = pSVar2[(int)io1].val.tt_;
      (to->top).p = (StkId)((to->top).offset + 0x10);
    }
  }
  return;
}

Assistant:

LUA_API void lua_xmove (lua_State *from, lua_State *to, int n) {
  int i;
  if (from == to) return;
  lua_lock(to);
  api_checknelems(from, n);
  api_check(from, G(from) == G(to), "moving among independent states");
  api_check(from, to->ci->top.p - to->top.p >= n, "stack overflow");
  from->top.p -= n;
  for (i = 0; i < n; i++) {
    setobjs2s(to, to->top.p, from->top.p + i);
    to->top.p++;  /* stack already checked by previous 'api_check' */
  }
  lua_unlock(to);
}